

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snapshot-file.c
# Opt level: O0

int faup_snapshot_file_zip(char *dirpath)

{
  FILE *__stream;
  DIR *pDVar1;
  int iVar2;
  mz_bool mVar3;
  int *piVar4;
  char *pcVar5;
  size_t __size;
  void *__ptr;
  size_t sVar6;
  size_t readval;
  char *pcStack_160;
  int retval_1;
  char *full_file_path;
  undefined1 local_150 [4];
  int retval;
  stat_conflict zipstats;
  mz_zip_archive zip_archive;
  mz_bool status;
  void *file_content;
  long file_size;
  char *zip_filename;
  FILE *fp;
  dirent *ent;
  DIR *dir;
  char *dirpath_local;
  
  dir = (DIR *)dirpath;
  ent = (dirent *)opendir(dirpath);
  pDVar1 = dir;
  __stream = _stderr;
  if (ent == (dirent *)0x0) {
    piVar4 = __errno_location();
    pcVar5 = strerror(*piVar4);
    fprintf(__stream,"Error reading directory \'%s\': %s\n",pDVar1,pcVar5);
  }
  else {
    full_file_path._4_4_ = asprintf((char **)&file_size,"%s.urls",dir);
    if (full_file_path._4_4_ < 0) {
      fprintf(_stderr,"Error: cannot concatenate snapshot urls with dirpath!\n");
    }
    else {
      full_file_path._4_4_ = stat((char *)file_size,(stat *)local_150);
      if (full_file_path._4_4_ != 0) {
        while( true ) {
          while( true ) {
            do {
              fp = (FILE *)readdir((DIR *)ent);
              if ((dirent *)fp == (dirent *)0x0) {
                free((void *)file_size);
                closedir((DIR *)ent);
                return 0;
              }
            } while (((dirent *)fp)->d_name[0] == '.');
            iVar2 = asprintf(&stack0xfffffffffffffea0,"%s%c%s",dir,0x2f,((dirent *)fp)->d_name);
            if (-1 < iVar2) break;
            fprintf(_stderr,"Error: cannot concatenate filename with dirpath!\n");
          }
          zip_filename = (char *)fopen(pcStack_160,"rb");
          if ((FILE *)zip_filename == (FILE *)0x0) {
            fprintf(_stderr,"Cannot open file %s for reading!\n",pcStack_160);
            free(pcStack_160);
            return -1;
          }
          fseek((FILE *)zip_filename,0,2);
          __size = ftell((FILE *)zip_filename);
          fseek((FILE *)zip_filename,0,0);
          __ptr = malloc(__size + 1);
          if (__ptr == (void *)0x0) break;
          sVar6 = fread(__ptr,__size,1,(FILE *)zip_filename);
          if (sVar6 == 0) {
            fprintf(_stderr,"Error reading file %s\n",pcStack_160);
            free(pcStack_160);
            goto LAB_0012d0c9;
          }
          mVar3 = mz_zip_add_mem_to_archive_file_in_place
                            ((char *)file_size,pcStack_160,__ptr,__size,(void *)0x0,0,9);
          if (mVar3 == 0) {
            fprintf(_stderr,"Cannot create %s!\n",pcStack_160);
            free(pcStack_160);
            goto LAB_0012d0c9;
          }
          fclose((FILE *)zip_filename);
          free(__ptr);
          free(pcStack_160);
        }
        fprintf(_stderr,"Cannot allocate the file size content:%lu",__size);
        free(pcStack_160);
LAB_0012d0c9:
        fclose((FILE *)zip_filename);
        free(__ptr);
        return -1;
      }
      fprintf(_stderr,"The snapshot %s already exists!\n",file_size);
      free((void *)file_size);
      closedir((DIR *)ent);
    }
  }
  return -1;
}

Assistant:

int faup_snapshot_file_zip(char *dirpath)
{
  DIR *dir;
  struct dirent *ent;
  FILE *fp;

  char *zip_filename;
  long file_size;
  void *file_content;

  mz_bool status;
  mz_zip_archive zip_archive;

  struct stat zipstats;
  int retval;

  dir = opendir(dirpath);
  if (!dir) {
    fprintf(stderr, "Error reading directory '%s': %s\n", dirpath, strerror(errno));
    return -1;
  }

  retval = asprintf(&zip_filename, "%s.urls", dirpath);
  if (retval < 0) {
    fprintf(stderr, "Error: cannot concatenate snapshot urls with dirpath!\n");
    return -1;
  }
  
  retval = stat(zip_filename, &zipstats);
  if (retval == 0) {
    fprintf(stderr, "The snapshot %s already exists!\n", zip_filename);
    free(zip_filename);
    closedir(dir);
    return -1;
  }

  while ((ent = readdir(dir)) != NULL) {
      char *full_file_path;
      int retval;
      size_t readval;

      if (ent->d_name[0] == '.') { continue; }

      retval = asprintf(&full_file_path, "%s%c%s", dirpath, FAUP_OS_DIRSEP_C, ent->d_name);
      if (retval < 0) {
	fprintf(stderr, "Error: cannot concatenate filename with dirpath!\n");
	continue;
      }
      
      fp = fopen(full_file_path, "rb");
      if (!fp) {
	fprintf(stderr, "Cannot open file %s for reading!\n", full_file_path);
	free(full_file_path);
	return -1;
      }
      fseek(fp, 0, SEEK_END);
      file_size = ftell(fp);
      fseek(fp, 0, SEEK_SET);
      
      file_content = malloc(file_size + 1);
      if (!file_content) {
	fprintf(stderr, "Cannot allocate the file size content:%lu", file_size);
	free(full_file_path);
	goto err;
      }

      readval = fread(file_content, file_size, 1, fp);
      if (readval == 0) {
	fprintf(stderr, "Error reading file %s\n", full_file_path);
	free(full_file_path);
	goto err;
      }
      status = mz_zip_add_mem_to_archive_file_in_place(zip_filename, full_file_path, file_content, file_size, NULL, 0, MZ_BEST_COMPRESSION);
      if (!status) {
      	fprintf(stderr, "Cannot create %s!\n", full_file_path);
	free(full_file_path);
	goto err;
      }

      /* printf("file name:%s\n", full_file_path); */
      
      fclose(fp);
      free(file_content);
      free(full_file_path);
  }

  free(zip_filename);

  closedir(dir);
  
  return 0;

 err:
  fclose(fp);
  free(file_content);
  return -1;
}